

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles3::Performance::anon_unknown_1::UploadWaitDrawCase::checkSampleTemporalStability
          (UploadWaitDrawCase *this,offset_in_Result_to_deUint64 target,char *description)

{
  ostringstream *this_00;
  int iVar1;
  pointer piVar2;
  pointer pRVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  size_type __n;
  float fVar7;
  float fVar8;
  vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> dataPoints;
  _Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> local_1e0;
  float local_1c8;
  undefined4 uStack_1c4;
  undefined4 uStack_1c0;
  undefined4 uStack_1bc;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [384];
  
  __n = (long)(this->m_iterationOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(this->m_iterationOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start >> 2;
  std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
            ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)&local_1e0,
             __n,(allocator_type *)local_1a8);
  piVar2 = (this->m_iterationOrder).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (ulong)((long)(this->m_iterationOrder).super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_finish - (long)piVar2) >> 2;
  pRVar3 = (this->m_results).
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadWaitDrawCase::Result>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar6 = 0;
  uVar5 = uVar4 & 0xffffffff;
  if ((int)uVar4 < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    iVar1 = piVar2[uVar6];
    local_1e0._M_impl.super__Vector_impl_data._M_start[iVar1].m_data[0] = (float)(int)uVar6;
    local_1e0._M_impl.super__Vector_impl_data._M_start[iVar1].m_data[1] =
         (float)*(ulong *)((long)&pRVar3[iVar1].uploadDuration + target);
  }
  deqp::gls::theilSenSiegelLinearRegression
            ((LineParametersWithConfidence *)local_1a8,
             (vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)&local_1e0,
             0.6);
  local_1b8 = ZEXT416((uint)local_1a8._12_4_);
  fVar8 = -(float)local_1a8._12_4_;
  if (-(float)local_1a8._12_4_ <= (float)local_1a8._12_4_) {
    fVar8 = (float)local_1a8._12_4_;
  }
  fVar8 = (float)(int)__n * fVar8;
  fVar7 = -(float)local_1a8._0_4_;
  if (-(float)local_1a8._0_4_ <= (float)local_1a8._0_4_) {
    fVar7 = (float)local_1a8._0_4_;
  }
  fVar7 = fVar7 * 0.25;
  if (fVar7 < fVar8) {
    uStack_1c4 = 0x80000000;
    uStack_1c0 = 0x80000000;
    uStack_1bc = 0x80000000;
    local_1a8._0_8_ =
         ((this->super_RenderPerformanceTestBase).super_TestCase.super_TestCase.super_TestNode.
         m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_1a8 + 8);
    local_1c8 = fVar7;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::operator<<((ostream *)this_00,description);
    std::operator<<((ostream *)this_00,
                    ": Correlation with data point observation order and result time. Results are not temporally stable, observations are not independent.\n"
                   );
    std::operator<<((ostream *)this_00,"\tCoefficient: ");
    std::ostream::operator<<(this_00,(float)local_1b8._0_4_);
    std::operator<<((ostream *)this_00," (us / observation)\n");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    fVar7 = local_1c8;
  }
  std::_Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::~_Vector_base
            (&local_1e0);
  return fVar8 <= fVar7;
}

Assistant:

bool UploadWaitDrawCase::checkSampleTemporalStability (deUint64 (UploadWaitDrawCase::Result::*target), const char* description)
{
	// Try to find correlation with sample order and sample times

	const int						numDataPoints	= (int)m_iterationOrder.size();
	std::vector<tcu::Vec2>			dataPoints		(m_iterationOrder.size());
	LineParametersWithConfidence	lineFit;

	for (int ndx = 0; ndx < (int)m_iterationOrder.size(); ++ndx)
	{
		dataPoints[m_iterationOrder[ndx]].x() = (float)ndx;
		dataPoints[m_iterationOrder[ndx]].y() = (float)(m_results[m_iterationOrder[ndx]].*target);
	}

	lineFit = theilSenSiegelLinearRegression(dataPoints, 0.6f);

	// Difference of more than 25% of the offset along the whole sample range
	if (de::abs(lineFit.coefficient) * (float)numDataPoints > de::abs(lineFit.offset) * 0.25f)
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< description << ": Correlation with data point observation order and result time. Results are not temporally stable, observations are not independent.\n"
			<< "\tCoefficient: " << lineFit.coefficient << " (us / observation)\n"
			<< tcu::TestLog::EndMessage;

		return false;
	}
	else
		return true;
}